

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcp_dialer_free(void *arg)

{
  tcp_dialer *d;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    nni_aio_stop((nni_aio *)((long)arg + 0x1e0));
    nni_aio_stop((nni_aio *)((long)arg + 0x3a8));
    nni_aio_fini((nni_aio *)((long)arg + 0x1e0));
    nni_aio_fini((nni_aio *)((long)arg + 0x3a8));
    if (*(long *)((long)arg + 0x1d8) != 0) {
      nni_tcp_dialer_close(*(nni_tcp_dialer **)((long)arg + 0x1d8));
      nni_tcp_dialer_fini(*(nni_tcp_dialer **)((long)arg + 0x1d8));
    }
    nni_mtx_fini((nni_mtx *)((long)arg + 0x588));
    nni_free(arg,0x5d0);
  }
  return;
}

Assistant:

static void
tcp_dialer_free(void *arg)
{
	tcp_dialer *d = arg;

	if (d == NULL) {
		return;
	}

	nni_aio_stop(&d->resaio);
	nni_aio_stop(&d->conaio);
	nni_aio_fini(&d->resaio);
	nni_aio_fini(&d->conaio);

	if (d->d != NULL) {
		nni_tcp_dialer_close(d->d);
		nni_tcp_dialer_fini(d->d);
	}
	nni_mtx_fini(&d->mtx);
	NNI_FREE_STRUCT(d);
}